

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O0

QString * __thiscall
Driver::findOrInsert<DomWidget>
          (Driver *this,DomObjectHash<DomWidget> *domHash,DomWidget *dom,QString *className,
          bool isMember)

{
  long lVar1;
  bool bVar2;
  QString *in_RDX;
  QString *in_RDI;
  byte in_R9B;
  long in_FS_OFFSET;
  QString name;
  iterator it;
  DomWidget *in_stack_ffffffffffffff18;
  QString *in_stack_ffffffffffffff20;
  QString *this_00;
  QString *local_98;
  QString *in_stack_ffffffffffffff78;
  Driver *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QHash<const_DomWidget_*,_QString>::find
            ((QHash<const_DomWidget_*,_QString> *)in_stack_ffffffffffffff20,
             (DomWidget **)in_stack_ffffffffffffff18);
  QHash<const_DomWidget_*,_QString>::end((QHash<const_DomWidget_*,_QString> *)this_00);
  bVar2 = QHash<const_DomWidget_*,_QString>::iterator::operator==
                    ((iterator *)this_00,(iterator *)in_stack_ffffffffffffff20);
  if (bVar2) {
    DomWidget::attributeName(in_stack_ffffffffffffff18);
    unique(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,local_98);
    QString::~QString((QString *)0x178a4e);
    if ((in_R9B & 1) == 0) {
      QString::QString(in_RDX,&in_stack_ffffffffffffff18->m_attr_class);
      in_stack_ffffffffffffff20 = in_RDX;
    }
    else {
      ::operator+(in_RDX,&in_stack_ffffffffffffff18->m_attr_class);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QString_&,_const_QString_&> *)in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff20 = in_RDX;
    }
    QHash<const_DomWidget_*,_QString>::insert
              ((QHash<const_DomWidget_*,_QString> *)in_stack_ffffffffffffff20,
               (DomWidget **)in_stack_ffffffffffffff18,(QString *)0x178ab7);
    QString::~QString((QString *)0x178aeb);
    QString::~QString((QString *)0x178af8);
  }
  QHash<const_DomWidget_*,_QString>::iterator::value((iterator *)0x178b05);
  QString::QString(in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->m_attr_class);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString Driver::findOrInsert(DomObjectHash<DomClass> *domHash, const DomClass *dom,
                             const QString &className, bool isMember)
{
    auto it = domHash->find(dom);
    if (it == domHash->end()) {
        const QString name = this->unique(dom->attributeName(), className);
        it = domHash->insert(dom, isMember ? language::self + name : name);
    }
    return it.value();
}